

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpi_enc_test.c
# Opt level: O0

void * enc_test(void *arg)

{
  MppEncRcMode MVar1;
  MPP_RET MVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  RK_S64 t_e;
  RK_S64 t_s;
  MPP_RET ret;
  RK_U32 quiet;
  MppPollType timeout;
  MpiEncMultiCtxRet *enc_ret;
  MpiEncTestData *p;
  MpiEncTestArgs *cmd;
  MpiEncMultiCtxInfo *info;
  void *arg_local;
  
  p = *arg;
  enc_ret = (MpiEncMultiCtxRet *)((long)arg + 0x20);
  _quiet = (float *)((long)arg + 0x1370);
  ret = MPP_NOK;
  MVar1 = (p->rc_cfg).rc_mode;
  cmd = (MpiEncTestArgs *)arg;
  info = (MpiEncMultiCtxInfo *)arg;
  if (MVar1 == MPP_ENC_RC_MODE_VBR) {
    _mpp_log_l(4,"mpi_enc_test","%s start\n",0,*(undefined8 *)((long)arg + 8));
  }
  MVar2 = test_ctx_init((MpiEncMultiCtxInfo *)cmd);
  if (MVar2 == MPP_OK) {
    iVar3 = mpp_buffer_group_get(&enc_ret[0x61].stream_size,0x20003,0,"mpi_enc_test","enc_test");
    if (iVar3 == 0) {
      iVar3 = mpp_buffer_get_with_tag
                        (enc_ret[0x61].stream_size,&enc_ret[0x61].delay,
                         enc_ret[99].delay + enc_ret[99].stream_size,"mpi_enc_test","enc_test");
      if (iVar3 == 0) {
        iVar3 = mpp_buffer_get_with_tag
                          (enc_ret[0x61].stream_size,enc_ret + 0x62,enc_ret[99].delay,"mpi_enc_test"
                           ,"enc_test");
        if (iVar3 == 0) {
          iVar3 = mpp_buffer_get_with_tag
                            (enc_ret[0x61].stream_size,&enc_ret[0x62].bit_rate,
                             *(undefined8 *)(enc_ret + 100),"mpi_enc_test","enc_test");
          if (iVar3 == 0) {
            iVar3 = mpp_create(enc_ret,&enc_ret->bit_rate);
            if (iVar3 == 0) {
              if (MVar1 == MPP_ENC_RC_MODE_VBR) {
                _mpp_log_l(4,"mpi_enc_test","%p encoder test start w %d h %d type %d\n",0,
                           *(undefined8 *)enc_ret,enc_ret[0x62].frame_count,
                           *(undefined4 *)&enc_ret[0x62].field_0x1c,
                           *(undefined4 *)((long)&enc_ret[0x62].delay + 4));
              }
              iVar3 = (**(code **)(enc_ret->bit_rate + 0x70))(*(undefined8 *)enc_ret,0x200007,&ret);
              if (iVar3 == 0) {
                if ((p->rc_cfg).fps_out_num != 0) {
                  kmpp_cfg_init((MpiEncMultiCtxInfo *)cmd);
                }
                iVar3 = mpp_init(*(undefined8 *)enc_ret,1,
                                 *(undefined4 *)((long)&enc_ret[0x62].delay + 4));
                if (iVar3 == 0) {
                  iVar3 = mpp_enc_cfg_init(&enc_ret[1].stream_size);
                  if (iVar3 == 0) {
                    iVar3 = (**(code **)(enc_ret->bit_rate + 0x70))
                                      (*(undefined8 *)enc_ret,0x320002,enc_ret[1].stream_size);
                    if (iVar3 == 0) {
                      MVar2 = test_mpp_enc_cfg_setup((MpiEncMultiCtxInfo *)cmd);
                      if (MVar2 == MPP_OK) {
                        lVar4 = mpp_time();
                        MVar2 = test_mpp_run((MpiEncMultiCtxInfo *)cmd);
                        lVar5 = mpp_time();
                        if (MVar2 == MPP_OK) {
                          iVar3 = (**(code **)(enc_ret->bit_rate + 0x68))(*(undefined8 *)enc_ret);
                          if (iVar3 == 0) {
                            *(long *)(_quiet + 4) = lVar5 - lVar4;
                            _quiet[6] = *(float *)((long)&enc_ret->stream_size + 4);
                            *(RK_S64 *)(_quiet + 8) = enc_ret->delay;
                            *_quiet = ((float)*(int *)((long)&enc_ret->stream_size + 4) * 1e+06) /
                                      (float)*(long *)(_quiet + 4);
                            *(ulong *)(_quiet + 2) =
                                 (ulong)(enc_ret->delay * 8 *
                                        (long)((int)enc_ret[0x65].elapsed_time /
                                              *(int *)((long)&enc_ret[0x65].bit_rate + 4))) /
                                 (ulong)(long)*(int *)((long)&enc_ret->stream_size + 4);
                            *(RK_S64 *)(_quiet + 10) =
                                 enc_ret[0x66].delay - enc_ret[0x66].stream_size;
                          }
                          else {
                            _mpp_log_l(2,"mpi_enc_test","mpi->reset failed\n",0);
                          }
                        }
                        else {
                          _mpp_log_l(2,"mpi_enc_test","test mpp run failed ret %d\n","enc_test",
                                     MVar2);
                        }
                      }
                      else {
                        _mpp_log_l(2,"mpi_enc_test","test mpp setup failed ret %d\n","enc_test",
                                   MVar2);
                      }
                    }
                    else {
                      _mpp_log_l(2,"mpi_enc_test","get enc cfg failed ret %d\n","enc_test",iVar3);
                    }
                  }
                  else {
                    _mpp_log_l(2,"mpi_enc_test","mpp_enc_cfg_init failed ret %d\n","enc_test",iVar3)
                    ;
                  }
                }
                else {
                  _mpp_log_l(2,"mpi_enc_test","mpp_init failed ret %d\n",0,iVar3);
                }
              }
              else {
                _mpp_log_l(2,"mpi_enc_test","mpi control set output timeout %d ret %d\n",0,ret,iVar3
                          );
              }
            }
            else {
              _mpp_log_l(2,"mpi_enc_test","mpp_create failed ret %d\n",0,iVar3);
            }
          }
          else {
            _mpp_log_l(2,"mpi_enc_test",
                       "failed to get buffer for motion info output packet ret %d\n","enc_test",
                       iVar3);
          }
        }
        else {
          _mpp_log_l(2,"mpi_enc_test","failed to get buffer for output packet ret %d\n","enc_test",
                     iVar3);
        }
      }
      else {
        _mpp_log_l(2,"mpi_enc_test","failed to get buffer for input frame ret %d\n","enc_test",iVar3
                  );
      }
    }
    else {
      _mpp_log_l(2,"mpi_enc_test","failed to get mpp buffer group ret %d\n","enc_test",iVar3);
    }
  }
  else {
    _mpp_log_l(2,"mpi_enc_test","test data init failed ret %d\n","enc_test",MVar2);
  }
  if (*(long *)enc_ret != 0) {
    mpp_destroy(*(undefined8 *)enc_ret);
    *(undefined8 *)enc_ret = 0;
  }
  if (enc_ret[1].stream_size != 0) {
    mpp_enc_cfg_deinit(enc_ret[1].stream_size);
    enc_ret[1].stream_size = 0;
  }
  if (enc_ret[0x61].delay != 0) {
    mpp_buffer_put_with_caller(enc_ret[0x61].delay,"enc_test");
    enc_ret[0x61].delay = 0;
  }
  if (*(long *)(enc_ret + 0x62) != 0) {
    mpp_buffer_put_with_caller(*(undefined8 *)(enc_ret + 0x62),"enc_test");
    *(undefined8 *)(enc_ret + 0x62) = 0;
  }
  if (enc_ret[0x62].bit_rate != 0) {
    mpp_buffer_put_with_caller(enc_ret[0x62].bit_rate,"enc_test");
    enc_ret[0x62].bit_rate = 0;
  }
  if (enc_ret[0x5b].delay != 0) {
    mpp_buffer_put_with_caller(enc_ret[0x5b].delay,"enc_test");
    enc_ret[0x5b].delay = 0;
  }
  if (enc_ret[0x61].stream_size != 0) {
    mpp_buffer_group_put(enc_ret[0x61].stream_size);
    enc_ret[0x61].stream_size = 0;
  }
  if (enc_ret[99].elapsed_time != 0) {
    mpp_enc_roi_deinit((MppEncRoiCtx)enc_ret[99].elapsed_time);
    enc_ret[99].elapsed_time = 0;
  }
  if (*(long *)&enc_ret[99].frame_count != 0) {
    mpp_venc_kcfg_deinit(*(undefined8 *)&enc_ret[99].frame_count);
  }
  test_ctx_deinit((MpiEncTestData *)enc_ret);
  return (void *)0x0;
}

Assistant:

void *enc_test(void *arg)
{
    MpiEncMultiCtxInfo *info = (MpiEncMultiCtxInfo *)arg;
    MpiEncTestArgs *cmd = info->cmd;
    MpiEncTestData *p = &info->ctx;
    MpiEncMultiCtxRet *enc_ret = &info->ret;
    MppPollType timeout = MPP_POLL_BLOCK;
    RK_U32 quiet = cmd->quiet;
    MPP_RET ret = MPP_OK;
    RK_S64 t_s = 0;
    RK_S64 t_e = 0;

    mpp_log_q(quiet, "%s start\n", info->name);

    ret = test_ctx_init(info);
    if (ret) {
        mpp_err_f("test data init failed ret %d\n", ret);
        goto MPP_TEST_OUT;
    }

    ret = mpp_buffer_group_get_internal(&p->buf_grp, MPP_BUFFER_TYPE_DRM | MPP_BUFFER_FLAGS_CACHABLE);
    if (ret) {
        mpp_err_f("failed to get mpp buffer group ret %d\n", ret);
        goto MPP_TEST_OUT;
    }

    ret = mpp_buffer_get(p->buf_grp, &p->frm_buf, p->frame_size + p->header_size);
    if (ret) {
        mpp_err_f("failed to get buffer for input frame ret %d\n", ret);
        goto MPP_TEST_OUT;
    }

    ret = mpp_buffer_get(p->buf_grp, &p->pkt_buf, p->frame_size);
    if (ret) {
        mpp_err_f("failed to get buffer for output packet ret %d\n", ret);
        goto MPP_TEST_OUT;
    }

    ret = mpp_buffer_get(p->buf_grp, &p->md_info, p->mdinfo_size);
    if (ret) {
        mpp_err_f("failed to get buffer for motion info output packet ret %d\n", ret);
        goto MPP_TEST_OUT;
    }

    // encoder demo
    ret = mpp_create(&p->ctx, &p->mpi);
    if (ret) {
        mpp_err("mpp_create failed ret %d\n", ret);
        goto MPP_TEST_OUT;
    }

    mpp_log_q(quiet, "%p encoder test start w %d h %d type %d\n",
              p->ctx, p->width, p->height, p->type);

    ret = p->mpi->control(p->ctx, MPP_SET_OUTPUT_TIMEOUT, &timeout);
    if (MPP_OK != ret) {
        mpp_err("mpi control set output timeout %d ret %d\n", timeout, ret);
        goto MPP_TEST_OUT;
    }

    if (cmd->kmpp_en)
        kmpp_cfg_init(info);

    ret = mpp_init(p->ctx, MPP_CTX_ENC, p->type);
    if (ret) {
        mpp_err("mpp_init failed ret %d\n", ret);
        goto MPP_TEST_OUT;
    }

    ret = mpp_enc_cfg_init(&p->cfg);
    if (ret) {
        mpp_err_f("mpp_enc_cfg_init failed ret %d\n", ret);
        goto MPP_TEST_OUT;
    }

    ret = p->mpi->control(p->ctx, MPP_ENC_GET_CFG, p->cfg);
    if (ret) {
        mpp_err_f("get enc cfg failed ret %d\n", ret);
        goto MPP_TEST_OUT;
    }

    ret = test_mpp_enc_cfg_setup(info);
    if (ret) {
        mpp_err_f("test mpp setup failed ret %d\n", ret);
        goto MPP_TEST_OUT;
    }

    t_s = mpp_time();
    ret = test_mpp_run(info);
    t_e = mpp_time();
    if (ret) {
        mpp_err_f("test mpp run failed ret %d\n", ret);
        goto MPP_TEST_OUT;
    }

    ret = p->mpi->reset(p->ctx);
    if (ret) {
        mpp_err("mpi->reset failed\n");
        goto MPP_TEST_OUT;
    }

    enc_ret->elapsed_time = t_e - t_s;
    enc_ret->frame_count = p->frame_count;
    enc_ret->stream_size = p->stream_size;
    enc_ret->frame_rate = (float)p->frame_count * 1000000 / enc_ret->elapsed_time;
    enc_ret->bit_rate = (p->stream_size * 8 * (p->fps_out_num / p->fps_out_den)) / p->frame_count;
    enc_ret->delay = p->first_pkt - p->first_frm;

MPP_TEST_OUT:
    if (p->ctx) {
        mpp_destroy(p->ctx);
        p->ctx = NULL;
    }

    if (p->cfg) {
        mpp_enc_cfg_deinit(p->cfg);
        p->cfg = NULL;
    }

    if (p->frm_buf) {
        mpp_buffer_put(p->frm_buf);
        p->frm_buf = NULL;
    }

    if (p->pkt_buf) {
        mpp_buffer_put(p->pkt_buf);
        p->pkt_buf = NULL;
    }

    if (p->md_info) {
        mpp_buffer_put(p->md_info);
        p->md_info = NULL;
    }

    if (p->osd_data.buf) {
        mpp_buffer_put(p->osd_data.buf);
        p->osd_data.buf = NULL;
    }

    if (p->buf_grp) {
        mpp_buffer_group_put(p->buf_grp);
        p->buf_grp = NULL;
    }

    if (p->roi_ctx) {
        mpp_enc_roi_deinit(p->roi_ctx);
        p->roi_ctx = NULL;
    }
    if (p->init_kcfg)
        mpp_venc_kcfg_deinit(p->init_kcfg);

    test_ctx_deinit(p);

    return NULL;
}